

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

void FAudioVoice_DestroyVoice(FAudioVoice *voice)

{
  FAudioVoiceType FVar1;
  float *pfVar2;
  FAudioBufferEntry *pFVar3;
  FAudioSendDescriptor *pFVar4;
  FAudioBufferEntry *pFVar5;
  uint uVar6;
  FAudio *pFVar7;
  FAudioFilterState **ppafVar8;
  ulong uVar9;
  
  FAudio_OPERATIONSET_ClearAllForVoice(voice);
  FVar1 = voice->type;
  if (FVar1 == FAUDIO_VOICE_MASTER) {
    pFVar7 = voice->audio;
    if (pFVar7->platform != (void *)0x0) {
      FAudio_PlatformQuit(pFVar7->platform);
      pFVar7 = voice->audio;
      pFVar7->platform = (void *)0x0;
    }
    pfVar2 = (voice->field_19).mix.inputCache;
    if (pfVar2 != (float *)0x0) {
      (*pFVar7->pFree)(pfVar2);
      pFVar7 = voice->audio;
    }
    pFVar7->master = (FAudioMasteringVoice *)0x0;
  }
  else if (FVar1 == FAUDIO_VOICE_SUBMIX) {
    pFVar7 = voice->audio;
    LinkedList_RemoveEntry(&pFVar7->submixes,voice,pFVar7->submixLock,pFVar7->pFree);
    (*voice->audio->pFree)((voice->field_19).mix.inputCache);
  }
  else if (FVar1 == FAUDIO_VOICE_SOURCE) {
    while( true ) {
      FAudio_PlatformLockMutex(voice->audio->sourceLock);
      pFVar7 = voice->audio;
      if (pFVar7->processingSource != voice) break;
      FAudio_PlatformUnlockMutex(pFVar7->sourceLock);
    }
    LinkedList_RemoveEntry(&pFVar7->sources,voice,pFVar7->sourceLock,pFVar7->pFree);
    FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
    pFVar5 = (voice->field_19).src.bufferList;
    while (pFVar5 != (FAudioBufferEntry *)0x0) {
      pFVar3 = pFVar5->next;
      (*voice->audio->pFree)(pFVar5);
      pFVar5 = pFVar3;
    }
    pFVar5 = (voice->field_19).src.flushList;
    while (pFVar5 != (FAudioBufferEntry *)0x0) {
      pFVar3 = pFVar5->next;
      (*voice->audio->pFree)(pFVar5);
      pFVar5 = pFVar3;
    }
    (*voice->audio->pFree)((voice->field_19).src.format);
    FAudio_PlatformDestroyMutex((voice->field_19).src.bufferLock);
  }
  if (voice->sendLock != (FAudioMutex)0x0) {
    FAudio_PlatformLockMutex(voice->sendLock);
    if ((voice->sends).SendCount == 0) {
      uVar6 = 0;
    }
    else {
      uVar9 = 0;
      do {
        (*voice->audio->pFree)(voice->sendCoefficients[uVar9]);
        uVar9 = uVar9 + 1;
        uVar6 = (voice->sends).SendCount;
      } while (uVar9 < uVar6);
    }
    if (voice->sendCoefficients != (float **)0x0) {
      (*voice->audio->pFree)(voice->sendCoefficients);
      uVar6 = (voice->sends).SendCount;
    }
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        (*voice->audio->pFree)(voice->mixCoefficients[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (voice->sends).SendCount);
    }
    if (voice->mixCoefficients != (float **)0x0) {
      (*voice->audio->pFree)(voice->mixCoefficients);
    }
    if (voice->sendMix != (FAudioMixCallback *)0x0) {
      (*voice->audio->pFree)(voice->sendMix);
    }
    if (voice->sendFilter != (FAudioFilterParameters *)0x0) {
      (*voice->audio->pFree)(voice->sendFilter);
    }
    ppafVar8 = voice->sendFilterState;
    if (ppafVar8 != (FAudioFilterState **)0x0) {
      uVar6 = (voice->sends).SendCount;
      if (uVar6 != 0) {
        uVar9 = 0;
        do {
          if (voice->sendFilterState[uVar9] != (FAudioFilterState *)0x0) {
            (*voice->audio->pFree)(voice->sendFilterState[uVar9]);
            uVar6 = (voice->sends).SendCount;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar6);
        ppafVar8 = voice->sendFilterState;
      }
      (*voice->audio->pFree)(ppafVar8);
    }
    pFVar4 = (voice->sends).pSends;
    if (pFVar4 != (FAudioSendDescriptor *)0x0) {
      (*voice->audio->pFree)(pFVar4);
    }
    FAudio_PlatformUnlockMutex(voice->sendLock);
    FAudio_PlatformDestroyMutex(voice->sendLock);
  }
  if (voice->effectLock != (FAudioMutex)0x0) {
    FAudio_PlatformLockMutex(voice->effectLock);
    FAudio_INTERNAL_FreeEffectChain(voice);
    FAudio_PlatformUnlockMutex(voice->effectLock);
    FAudio_PlatformDestroyMutex(voice->effectLock);
  }
  if (voice->filterLock != (FAudioMutex)0x0) {
    FAudio_PlatformLockMutex(voice->filterLock);
    if (voice->filterState != (FAudioFilterState *)0x0) {
      (*voice->audio->pFree)(voice->filterState);
    }
    FAudio_PlatformUnlockMutex(voice->filterLock);
    FAudio_PlatformDestroyMutex(voice->filterLock);
  }
  if (voice->volumeLock != (FAudioMutex)0x0) {
    FAudio_PlatformLockMutex(voice->volumeLock);
    if (voice->channelVolume != (float *)0x0) {
      (*voice->audio->pFree)(voice->channelVolume);
    }
    FAudio_PlatformUnlockMutex(voice->volumeLock);
    FAudio_PlatformDestroyMutex(voice->volumeLock);
  }
  FAudio_Release(voice->audio);
  (*voice->audio->pFree)(voice);
  return;
}

Assistant:

void FAudioVoice_DestroyVoice(FAudioVoice *voice)
{
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	/* TODO: Check for dependencies and remove from audio graph first! */
	FAudio_OPERATIONSET_ClearAllForVoice(voice);

	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		FAudioBufferEntry *entry, *next;

#ifdef FAUDIO_DUMP_VOICES
		FAudio_DUMPVOICE_Finalize((FAudioSourceVoice*) voice);
#endif /* FAUDIO_DUMP_VOICES */

		FAudio_PlatformLockMutex(voice->audio->sourceLock);
		LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		while (voice == voice->audio->processingSource)
		{
			FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
			LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)
			FAudio_PlatformLockMutex(voice->audio->sourceLock);
			LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		}
		LinkedList_RemoveEntry(
			&voice->audio->sources,
			voice,
			voice->audio->sourceLock,
			voice->audio->pFree
		);
		FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)

		entry = voice->src.bufferList;
		while (entry != NULL)
		{
			next = entry->next;
			voice->audio->pFree(entry);
			entry = next;
		}

		entry = voice->src.flushList;
		while (entry != NULL)
		{
			next = entry->next;
			voice->audio->pFree(entry);
			entry = next;
		}

		voice->audio->pFree(voice->src.format);
		LOG_MUTEX_DESTROY(voice->audio, voice->src.bufferLock)
		FAudio_PlatformDestroyMutex(voice->src.bufferLock);
#ifdef HAVE_WMADEC
		if (voice->src.wmadec)
		{
			FAudio_WMADEC_free(voice);
		}
#endif /* HAVE_WMADEC */
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		/* Remove submix from list */
		LinkedList_RemoveEntry(
			&voice->audio->submixes,
			voice,
			voice->audio->submixLock,
			voice->audio->pFree
		);

		/* Delete submix data */
		voice->audio->pFree(voice->mix.inputCache);
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		if (voice->audio->platform != NULL)
		{
			FAudio_PlatformQuit(voice->audio->platform);
			voice->audio->platform = NULL;
		}
		if (voice->master.effectCache != NULL)
		{
			voice->audio->pFree(voice->master.effectCache);
		}
		voice->audio->master = NULL;
	}

	if (voice->sendLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->sendLock);
		LOG_MUTEX_LOCK(voice->audio, voice->sendLock)
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			voice->audio->pFree(voice->sendCoefficients[i]);
		}
		if (voice->sendCoefficients != NULL)
		{
			voice->audio->pFree(voice->sendCoefficients);
		}
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			voice->audio->pFree(voice->mixCoefficients[i]);
		}
		if (voice->mixCoefficients != NULL)
		{
			voice->audio->pFree(voice->mixCoefficients);
		}
		if (voice->sendMix != NULL)
		{
			voice->audio->pFree(voice->sendMix);
		}
		if (voice->sendFilter != NULL)
		{
			voice->audio->pFree(voice->sendFilter);
		}
		if (voice->sendFilterState != NULL)
		{
			for (i = 0; i < voice->sends.SendCount; i += 1)
			{
				if (voice->sendFilterState[i] != NULL)
				{
					voice->audio->pFree(voice->sendFilterState[i]);
				}
			}
			voice->audio->pFree(voice->sendFilterState);
		}
		if (voice->sends.pSends != NULL)
		{
			voice->audio->pFree(voice->sends.pSends);
		}
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->sendLock)
		FAudio_PlatformDestroyMutex(voice->sendLock);
	}

	if (voice->effectLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->effectLock);
		LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
		FAudio_INTERNAL_FreeEffectChain(voice);
		FAudio_PlatformUnlockMutex(voice->effectLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->effectLock)
		FAudio_PlatformDestroyMutex(voice->effectLock);
	}

	if (voice->filterLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->filterLock);
		LOG_MUTEX_LOCK(voice->audio, voice->filterLock)
		if (voice->filterState != NULL)
		{
			voice->audio->pFree(voice->filterState);
		}
		FAudio_PlatformUnlockMutex(voice->filterLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->filterLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->filterLock)
		FAudio_PlatformDestroyMutex(voice->filterLock);
	}

	if (voice->volumeLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->volumeLock);
		LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)
		if (voice->channelVolume != NULL)
		{
			voice->audio->pFree(voice->channelVolume);
		}
		FAudio_PlatformUnlockMutex(voice->volumeLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->volumeLock)
		FAudio_PlatformDestroyMutex(voice->volumeLock);
	}

	LOG_API_EXIT(voice->audio)
	FAudio_Release(voice->audio);
	voice->audio->pFree(voice);
}